

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O1

void * metacallfms_await(void *func,char *buffer,size_t size,void *allocator,
                        _func_void_ptr_void_ptr_void_ptr *resolve_callback,
                        _func_void_ptr_void_ptr_void_ptr *reject_callback,void *data)

{
  type_id tVar1;
  type_id tVar2;
  int iVar3;
  signature s;
  size_t sVar4;
  signature v;
  type ptVar5;
  signature psVar6;
  serial s_00;
  value pvVar7;
  size_t sVar8;
  value *ppvVar9;
  value *ppvVar10;
  value pvVar11;
  void *v_00;
  bool bVar12;
  void *values [16];
  void *keys [16];
  type_id in_stack_fffffffffffffeac;
  void *local_138 [16];
  void *local_b8 [17];
  
  if (func != (void *)0x0) {
    s = function_signature((function_conflict)func);
    if (buffer == (char *)0x0 || size == 0) {
      sVar4 = signature_count(s);
      if (sVar4 == 0) {
        v = (signature)
            function_await((function_conflict)func,metacall_null_args,0,
                           (function_resolve_callback)resolve_callback,
                           (function_reject_callback)reject_callback,data);
        if (v != (signature)0x0) {
          ptVar5 = signature_get_return(s);
          if (ptVar5 == (type)0x0) {
            bVar12 = true;
          }
          else {
            tVar1 = type_index(ptVar5);
            tVar2 = value_type_id(v);
            bVar12 = tVar1 == tVar2;
            if ((!bVar12) &&
               (psVar6 = (signature)value_type_cast(resolve_callback,in_stack_fffffffffffffeac),
               s = v, psVar6 != (signature)0x0)) {
              s = psVar6;
            }
          }
          if (!bVar12) {
            return s;
          }
        }
        return v;
      }
    }
    else {
      s_00 = serial_create("rapid_json");
      pvVar7 = serial_deserialize(s_00,buffer,size,(memory_allocator)allocator);
      if (pvVar7 != (value)0x0) {
        tVar1 = value_type_id(pvVar7);
        iVar3 = type_id_map(tVar1);
        if (iVar3 == 0) {
          sVar4 = signature_count(s);
          sVar8 = value_type_count(pvVar7);
          if (sVar4 == sVar8) {
            ppvVar9 = value_to_map(pvVar7);
            if (sVar4 != 0) {
              sVar8 = 0;
              do {
                ppvVar10 = value_to_array(ppvVar9[sVar8]);
                pvVar11 = value_type_copy(*ppvVar10);
                local_b8[sVar8] = pvVar11;
                pvVar11 = value_type_copy(ppvVar10[1]);
                local_138[sVar8] = pvVar11;
                sVar8 = sVar8 + 1;
              } while (sVar4 != sVar8);
            }
            v_00 = metacallfmv_await(func,local_b8,local_138,resolve_callback,reject_callback,data);
            if (sVar4 != 0) {
              sVar8 = 0;
              do {
                value_type_destroy(local_b8[sVar8]);
                value_type_destroy(local_138[sVar8]);
                sVar8 = sVar8 + 1;
              } while (sVar4 != sVar8);
            }
            value_type_destroy(pvVar7);
            if (v_00 == (void *)0x0) {
              return (void *)0x0;
            }
            ptVar5 = signature_get_return(s);
            if (ptVar5 == (type)0x0) {
              return v_00;
            }
            tVar1 = type_index(ptVar5);
            tVar2 = value_type_id(v_00);
            if (tVar1 != tVar2) {
              pvVar7 = value_type_cast(resolve_callback,in_stack_fffffffffffffeac);
              if (pvVar7 != (value)0x0) {
                return pvVar7;
              }
              return v_00;
            }
            return v_00;
          }
        }
        value_type_destroy(pvVar7);
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *metacallfms_await(void *func, const char *buffer, size_t size, void *allocator, void *(*resolve_callback)(void *, void *), void *(*reject_callback)(void *, void *), void *data)
{
	function f = (function)func;

	if (f != NULL)
	{
		signature s = function_signature(f);

		if (buffer == NULL || size == 0)
		{
			if (signature_count(s) == 0)
			{
				value ret = function_await(f, metacall_null_args, 0, resolve_callback, reject_callback, data);

				if (ret != NULL)
				{
					type t = signature_get_return(s);

					if (t != NULL)
					{
						type_id id = type_index(t);

						if (id != value_type_id(ret))
						{
							value cast_ret = value_type_cast(ret, id);

							return (cast_ret == NULL) ? ret : cast_ret;
						}
					}
				}

				return ret;
			}

			return NULL;
		}
		else
		{
			void *keys[METACALL_ARGS_SIZE];
			void *values[METACALL_ARGS_SIZE];

			value *v_map, ret, v = (value)metacall_deserialize(metacall_serial(), buffer, size, allocator);

			size_t iterator, args_count;

			if (v == NULL)
			{
				return NULL;
			}

			if (type_id_map(value_type_id(v)) != 0)
			{
				value_type_destroy(v);

				return NULL;
			}

			args_count = signature_count(s);

			/* TODO: No optional arguments allowed, review in the future */
			if (args_count != value_type_count(v))
			{
				value_type_destroy(v);

				return NULL;
			}

			v_map = value_to_map(v);

			for (iterator = 0; iterator < args_count; ++iterator)
			{
				value element = v_map[iterator];
				value *v_element = value_to_array(element);

				/* This step is necessary in order to handle type castings */
				keys[iterator] = value_type_copy(v_element[0]);
				values[iterator] = value_type_copy(v_element[1]);
			}

			ret = metacallfmv_await(f, keys, values, resolve_callback, reject_callback, data);

			/* This step is necessary in order to handle type castings (otherwise it generates leaks) */
			for (iterator = 0; iterator < args_count; ++iterator)
			{
				value_type_destroy(keys[iterator]);
				value_type_destroy(values[iterator]);
			}

			value_type_destroy(v);

			if (ret != NULL)
			{
				type t = signature_get_return(s);

				if (t != NULL)
				{
					type_id id = type_index(t);

					if (id != value_type_id(ret))
					{
						value cast_ret = value_type_cast(ret, id);

						if (cast_ret != NULL)
						{
							ret = cast_ret;
						}
					}
				}
			}

			return ret;
		}
	}

	return NULL;
}